

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O0

bool Cmd::iequals(string_view a,string_view b)

{
  size_type sVar1;
  size_type sVar2;
  const_iterator pvVar3;
  const_iterator pvVar4;
  const_iterator pvVar5;
  const_iterator pvVar6;
  undefined1 local_30 [8];
  string_view b_local;
  string_view a_local;
  
  b_local._M_len = (size_t)b._M_str;
  local_30 = (undefined1  [8])b._M_len;
  b_local._M_str = (char *)a._M_len;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&b_local._M_str);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
  if (sVar1 == sVar2) {
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                       ((basic_string_view<char,_std::char_traits<char>_> *)&b_local._M_str);
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end
                       ((basic_string_view<char,_std::char_traits<char>_> *)&b_local._M_str);
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::end
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    a_local._M_str._7_1_ =
         std::
         equal<char_const*,char_const*,Cmd::iequals(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::_lambda(unsigned_char,unsigned_char)_1_>
                   (pvVar3,pvVar4,pvVar5,pvVar6);
  }
  else {
    a_local._M_str._7_1_ = false;
  }
  return a_local._M_str._7_1_;
}

Assistant:

static bool iequals(std::string_view a, std::string_view b) {
		if (a.size() != b.size()) {
			return false;
		}

		return std::equal(a.begin(), a.end(), b.begin(), b.end(), [](unsigned char a, unsigned char b) {
			return tolower(a) == tolower(b);
		});
	}